

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

String * operator<<(String *str,char (*t) [3])

{
  Log local_50 [2];
  Flags<LogOutput::LogFlag> local_30;
  undefined1 local_28 [8];
  Log l;
  char (*t_local) [3];
  String *str_local;
  
  l.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t;
  Flags<LogOutput::LogFlag>::Flags(&local_30,DefaultFlags);
  Log::Log((Log *)local_28,str,&local_30);
  Log::setSpacing((Log *)local_28,false);
  Log::operator<<(local_50,local_28);
  Log::~Log(local_50);
  Log::~Log((Log *)local_28);
  return str;
}

Assistant:

String &operator<<(String &str, const T &t)
{
    Log l(&str);
    l.setSpacing(false);
    l << t;
    return str;
}